

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_opt_l(void *ctx,char *next)

{
  int iVar1;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid loop count\n",0);
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x30) = iVar1;
  }
  return (uint)(next != (char *)0x0);
}

Assistant:

RK_S32 mpi_enc_opt_l(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->loop_cnt = atoi(next);
        return 1;
    }

    mpp_err("invalid loop count\n");
    return 0;
}